

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,wchar_t **value)

{
  Message *a_message;
  Message local_20;
  wchar_t **local_18;
  wchar_t **value_local;
  AssertionResult *this_local;
  
  local_18 = value;
  value_local = (wchar_t **)this;
  Message::Message(&local_20);
  a_message = Message::operator<<(&local_20,*local_18);
  AppendMessage(this,a_message);
  Message::~Message(&local_20);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }